

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O1

void __thiscall
leveldb::anon_unknown_1::PosixWritableFile::PosixWritableFile
          (PosixWritableFile *this,string *filename,int fd)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  long lVar3;
  pointer pcVar4;
  undefined8 uVar5;
  long lVar6;
  void *pvVar7;
  long *plVar8;
  ulong uVar9;
  size_type __n;
  size_type __size;
  ulong uVar11;
  long in_FS_OFFSET;
  bool bVar12;
  ulong uVar10;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  (this->super_WritableFile)._vptr_WritableFile = (_func_int **)&PTR__PosixWritableFile_00b18e70;
  this->pos_ = 0;
  this->fd_ = fd;
  uVar11 = filename->_M_string_length;
  if (uVar11 == 0) {
LAB_00665d0c:
    uVar9 = 0xffffffffffffffff;
  }
  else {
    uVar10 = uVar11;
    do {
      uVar9 = uVar10 - 1;
      if (uVar10 == 0) goto LAB_00665d0c;
      lVar6 = uVar10 - 1;
      uVar10 = uVar9;
    } while ((filename->_M_dataplus)._M_p[lVar6] != '/');
  }
  if (uVar9 == 0xffffffffffffffff) {
    plVar8 = (long *)(filename->_M_dataplus)._M_p;
  }
  else {
    uVar10 = uVar9 + 1;
    if ((uVar10 <= uVar11 && uVar11 - uVar10 != 0) &&
       (pcVar4 = (filename->_M_dataplus)._M_p, pvVar7 = memchr(pcVar4 + uVar10,0x2f,uVar11 - uVar10)
       , (long)pvVar7 - (long)pcVar4 != -1 && pvVar7 != (void *)0x0)) {
      __assert_fail("filename.find(\'/\', separator_pos + 1) == std::string::npos",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/util/env_posix.cc"
                    ,0x1ad,
                    "static Slice leveldb::(anonymous namespace)::PosixWritableFile::Basename(const std::string &)"
                   );
    }
    plVar8 = (long *)((filename->_M_dataplus)._M_p + uVar9 + 1);
    uVar11 = uVar11 + ~uVar9;
  }
  if (uVar11 < 8) {
    bVar12 = false;
  }
  else {
    bVar12 = *plVar8 == 0x54534546494e414d;
  }
  this->is_manifest_ = bVar12;
  this_00 = &this->filename_;
  paVar2 = &(this->filename_).field_2;
  (this->filename_)._M_dataplus._M_p = (pointer)paVar2;
  pcVar4 = (filename->_M_dataplus)._M_p;
  paVar1 = &filename->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 == paVar1) {
    uVar5 = *(undefined8 *)((long)&filename->field_2 + 8);
    paVar2->_M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->filename_).field_2 + 8) = uVar5;
  }
  else {
    (this_00->_M_dataplus)._M_p = pcVar4;
    paVar2->_M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  (this->filename_)._M_string_length = filename->_M_string_length;
  (filename->_M_dataplus)._M_p = (pointer)paVar1;
  filename->_M_string_length = 0;
  (filename->field_2)._M_local_buf[0] = '\0';
  uVar11 = (this->filename_)._M_string_length;
  if (uVar11 == 0) {
LAB_00665df9:
    __n = 0xffffffffffffffff;
  }
  else {
    uVar10 = uVar11;
    do {
      __n = uVar10 - 1;
      if (uVar10 == 0) goto LAB_00665df9;
      lVar6 = uVar10 - 1;
      uVar10 = __n;
    } while ((this_00->_M_dataplus)._M_p[lVar6] != '/');
  }
  if (__n == 0xffffffffffffffff) {
    (this->dirname_)._M_dataplus._M_p = (pointer)&(this->dirname_).field_2;
    *(undefined2 *)&(this->dirname_).field_2 = 0x2e;
    (this->dirname_)._M_string_length = 1;
  }
  else {
    uVar10 = __n + 1;
    if ((uVar10 <= uVar11 && uVar11 - uVar10 != 0) &&
       (pcVar4 = (this_00->_M_dataplus)._M_p, pvVar7 = memchr(pcVar4 + uVar10,0x2f,uVar11 - uVar10),
       (long)pvVar7 - (long)pcVar4 != -1 && pvVar7 != (void *)0x0)) {
      __assert_fail("filename.find(\'/\', separator_pos + 1) == std::string::npos",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/util/env_posix.cc"
                    ,0x19d,
                    "static std::string leveldb::(anonymous namespace)::PosixWritableFile::Dirname(const std::string &)"
                   );
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&this->dirname_,this_00,0,__n);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar3) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

PosixWritableFile(std::string filename, int fd)
      : pos_(0),
        fd_(fd),
        is_manifest_(IsManifest(filename)),
        filename_(std::move(filename)),
        dirname_(Dirname(filename_)) {}